

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int actioncmp(action *ap1,action *ap2)

{
  int iVar1;
  
  iVar1 = ap1->sp->index - ap2->sp->index;
  if (iVar1 == 0) {
    iVar1 = ap1->type - ap2->type;
    if ((iVar1 == 0) &&
       (((ap1->type | RD_RESOLVED) != SHIFTREDUCE ||
        (iVar1 = ((ap1->x).rp)->index - ((ap2->x).rp)->index, iVar1 == 0)))) {
      return (int)((ulong)((long)ap2 - (long)ap1) >> 3) * -0x33333333;
    }
  }
  return iVar1;
}

Assistant:

static int actioncmp(ap1,ap2)
struct action *ap1;
struct action *ap2;
{
  int rc;
  rc = ap1->sp->index - ap2->sp->index;
  if( rc==0 ){
    rc = (int)ap1->type - (int)ap2->type;
  }
  if( rc==0 && (ap1->type==REDUCE || ap1->type==SHIFTREDUCE) ){
    rc = ap1->x.rp->index - ap2->x.rp->index;
  }
  if( rc==0 ){
    rc = ap2 - ap1;
  }
  return rc;
}